

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalColumnDataGet::Deserialize(LogicalColumnDataGet *this,Deserializer *deserializer)

{
  undefined1 auVar1 [8];
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  _func_int **pp_Var5;
  LogicalColumnDataGet *this_00;
  pointer *__ptr;
  type tVar6;
  type ret;
  vector<duckdb::LogicalType,_true> chunk_types;
  undefined1 local_78 [8];
  ColumnDataCollection *pCStack_70;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  optionally_owned_ptr<duckdb::ColumnDataCollection> local_48;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_38;
  idx_t table_index;
  
  uVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"table_index");
  pp_Var5 = deserializer->_vptr_Deserializer;
  if ((char)uVar3 == '\0') {
    table_index = 0;
  }
  else {
    iVar4 = (*pp_Var5[0x15])(deserializer);
    table_index = CONCAT44(extraout_var,iVar4);
    pp_Var5 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var5[5])(deserializer,(ulong)(uVar3 & 0xff));
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            ((vector<duckdb::LogicalType,_true> *)&local_68,deserializer,0xc9,"chunk_types");
  iVar4 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"collection");
  if ((char)iVar4 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_78 = (undefined1  [8])0x0;
    pCStack_70 = (ColumnDataCollection *)0x0;
  }
  else {
    tVar6 = Deserializer::
            Read<duckdb::optionally_owned_ptr<duckdb::ColumnDataCollection>,duckdb::ColumnDataCollection>
                      ((Deserializer *)local_78);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1,tVar6.ptr.ptr.ptr);
  }
  this_00 = (LogicalColumnDataGet *)operator_new(0x98);
  local_48.ptr.ptr = pCStack_70;
  local_48.owned.
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       )(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
         )local_78;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = (undefined1  [8])0x0;
  pCStack_70 = (ColumnDataCollection *)0x0;
  LogicalColumnDataGet(this_00,table_index,(vector<duckdb::LogicalType,_true> *)&local_38,&local_48)
  ;
  uVar2.
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       )(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
         )local_48.owned;
  if ((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       )local_48.owned.
        super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
        .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       )0x0) {
    ColumnDataCollection::~ColumnDataCollection
              ((ColumnDataCollection *)
               local_48.owned.
               super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
               .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl);
    operator_delete((void *)uVar2.
                            super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
                            .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>.
                            _M_head_impl);
  }
  local_48.owned.
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       )(__uniq_ptr_data<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true,_true>
         )0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_38);
  auVar1 = local_78;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  if (local_78 != (undefined1  [8])0x0) {
    ColumnDataCollection::~ColumnDataCollection((ColumnDataCollection *)local_78);
    operator_delete((void *)auVar1);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalColumnDataGet::Deserialize(Deserializer &deserializer) {
	auto table_index = deserializer.ReadPropertyWithDefault<idx_t>(200, "table_index");
	auto chunk_types = deserializer.ReadPropertyWithDefault<vector<LogicalType>>(201, "chunk_types");
	auto collection = deserializer.ReadPropertyWithDefault<optionally_owned_ptr<ColumnDataCollection>>(202, "collection");
	auto result = duckdb::unique_ptr<LogicalColumnDataGet>(new LogicalColumnDataGet(table_index, std::move(chunk_types), std::move(collection)));
	return std::move(result);
}